

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_DUPM(DisasContext_conflict1 *s,arg_DUPM *a)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint vsz;
  uint64_t imm;
  uint64_t local_20;
  
  uVar1 = a->dbm;
  _Var2 = logic_imm_decode_wmask_aarch64(&local_20,uVar1 >> 0xc & 1,uVar1 & 0x3f,uVar1 >> 6 & 0x3f);
  if (_Var2) {
    _Var3 = sve_access_check_aarch64(s);
    if (_Var3) {
      tcg_gen_gvec_dup64i_aarch64
                (s->uc->tcg_ctx,a->rd * 0x100 + 0xc10,s->sve_len,s->sve_len,local_20);
    }
  }
  return _Var2;
}

Assistant:

static bool trans_DUPM(DisasContext *s, arg_DUPM *a)
{
    uint64_t imm;
    if (!logic_imm_decode_wmask(&imm, extract32(a->dbm, 12, 1),
                                extract32(a->dbm, 0, 6),
                                extract32(a->dbm, 6, 6))) {
        return false;
    }
    if (sve_access_check(s)) {
        do_dupi_z(s, a->rd, imm);
    }
    return true;
}